

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

void SkipMatchesSpec(UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
                    size_t _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint *puVar9;
  uint uVar10;
  uint *local_48;
  uint *local_40;
  
  local_48 = son + _cyclicBufferPos * 2;
  local_40 = son + _cyclicBufferPos * 2 + 1;
  uVar3 = pos - _cyclicBufferSize;
  if (pos < _cyclicBufferSize) {
    uVar3 = 0;
  }
  if (uVar3 < curMatch) {
    uVar10 = 0;
    uVar8 = 0;
    do {
      uVar2 = (ulong)(pos - curMatch);
      uVar5 = 0;
      if (_cyclicBufferPos < uVar2) {
        uVar5 = (ulong)_cyclicBufferSize;
      }
      uVar6 = uVar8;
      if (uVar10 < uVar8) {
        uVar6 = uVar10;
      }
      uVar7 = (ulong)uVar6;
      puVar9 = son + (uVar5 + (_cyclicBufferPos - uVar2)) * 2;
      bVar4 = cur[uVar7];
      bVar1 = cur[uVar7 - uVar2];
      while (uVar6 = (uint)uVar7, bVar1 == bVar4) {
        if (lenLimit - 1 == uVar6) {
          *local_48 = *puVar9;
          *local_40 = puVar9[1];
          return;
        }
        uVar7 = (ulong)(uVar6 + 1);
        bVar4 = cur[uVar7];
        bVar1 = cur[uVar7 - uVar2];
      }
      if (bVar1 < bVar4) {
        *local_48 = curMatch;
        puVar9 = puVar9 + 1;
        uVar8 = uVar6;
        local_48 = puVar9;
      }
      else {
        *local_40 = curMatch;
        uVar10 = uVar6;
        local_40 = puVar9;
      }
      cutValue = cutValue - 1;
    } while ((cutValue != 0) && (curMatch = *puVar9, uVar3 < curMatch));
  }
  *local_48 = 0;
  *local_40 = 0;
  return;
}

Assistant:

static void SkipMatchesSpec(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte *cur, CLzRef *son,
    size_t _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue)
{
  CLzRef *ptr0 = son + ((size_t)_cyclicBufferPos << 1) + 1;
  CLzRef *ptr1 = son + ((size_t)_cyclicBufferPos << 1);
  unsigned len0 = 0, len1 = 0;

  UInt32 cmCheck;

  cmCheck = (UInt32)(pos - _cyclicBufferSize);
  if ((UInt32)pos <= _cyclicBufferSize)
    cmCheck = 0;

  if (// curMatch >= pos ||  // failure
      cmCheck < curMatch)
  do
  {
    const UInt32 delta = pos - curMatch;
    {
      CLzRef *pair = son + ((size_t)(_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)) << 1);
      const Byte *pb = cur - delta;
      unsigned len = (len0 < len1 ? len0 : len1);
      if (pb[len] == cur[len])
      {
        while (++len != lenLimit)
          if (pb[len] != cur[len])
            break;
        {
          if (len == lenLimit)
          {
            *ptr1 = pair[0];
            *ptr0 = pair[1];
            return;
          }
        }
      }
      if (pb[len] < cur[len])
      {
        *ptr1 = curMatch;
        curMatch = pair[1];
        ptr1 = pair + 1;
        len1 = len;
      }
      else
      {
        *ptr0 = curMatch;
        curMatch = pair[0];
        ptr0 = pair;
        len0 = len;
      }
    }
  }
  while(--cutValue && cmCheck < curMatch);
  
  *ptr0 = *ptr1 = kEmptyHashValue;
  return;
}